

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O0

void RigidBodyDynamics::CalcConstraintsVelocityError
               (Model *model,VectorNd *Q,VectorNd *QDot,ConstraintSet *CS,VectorNd *err,
               bool update_kinematics)

{
  ulong uVar1;
  size_type sVar2;
  element_type *peVar3;
  Model *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  VectorNd *in_R8;
  undefined1 in_R9B;
  uint i;
  bool in_stack_ffffffffffffffc7;
  MatrixNd *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar4;
  undefined3 in_stack_ffffffffffffffd4;
  uint uVar5;
  
  uVar5 = CONCAT13(in_R9B,in_stack_ffffffffffffffd4) & 0x1ffffff;
  CalcConstraintsJacobian
            (in_RCX,in_R8,
             (ConstraintSet *)
             (CONCAT44(CONCAT13(in_R9B,in_stack_ffffffffffffffd4),in_stack_ffffffffffffffd0) &
             0x1ffffffffffffff),in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc7);
  uVar4 = 0;
  while( true ) {
    uVar1 = (ulong)uVar4;
    sVar2 = std::
            vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
            ::size((vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
                    *)&(in_RCX->S).
                       super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                       super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar2 <= uVar1) break;
    std::
    vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
    ::operator[]((vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
                  *)&(in_RCX->S).
                     super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                     super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar4);
    peVar3 = std::
             __shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x6d863e);
    (*peVar3->_vptr_Constraint[4])
              (0,peVar3,in_RDI,in_RSI,in_RDX,
               &(in_RCX->multdof3_Dinv).super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>.
                _M_impl.super__Vector_impl_data._M_finish,in_R8,&in_RCX[1].Ic,
               (uint)((byte)(uVar5 >> 0x18) & 1));
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

RBDL_DLLAPI
void CalcConstraintsVelocityError (
  Model& model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  ConstraintSet &CS,
  Math::VectorNd& err,
  bool update_kinematics
)
{


  CalcConstraintsJacobian (model, Q, CS, CS.G, update_kinematics);

  for(unsigned int i=0; i<CS.constraints.size(); ++i) {
    CS.constraints[i]->calcVelocityError(model,0,Q,QDot,CS.G,err,CS.cache,
                                         update_kinematics);
  }

}